

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O2

void sdf::RenderDepth(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps,
                     float max_ray_length,float min_ray_length,float precision,
                     vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                     Mat *Depth)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  double dVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  ResScalar RVar13;
  undefined1 auVar14 [16];
  undefined4 uVar15;
  undefined4 uVar16;
  double local_1b8;
  Matrix<double,_3,_1,_0,_3,_1> local_158;
  double local_140;
  Vector3d camera;
  Vector3d ret;
  Mat Z_img;
  long local_d0;
  long *local_98;
  Vector3d viewAxis;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Vector3d p;
  
  cv::Mat::Mat(&Z_img,rows,cols,5);
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Eigen::internal::
  transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
  ::run(&camera,transformation,&local_158);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0x3ff0000000001198;
  Eigen::internal::
  transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
  ::run((ResultType *)&p,transformation,(Matrix<double,_3,_1,_0,_3,_1> *)&local_68);
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)&camera;
  local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)&p;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::normalized(&viewAxis,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_158);
  uVar9 = (ulong)(uint)cols;
  if (cols < 1) {
    uVar9 = 0;
  }
  uVar7 = (ulong)(uint)rows;
  if (rows < 1) {
    uVar7 = 0;
  }
  uVar8 = 0;
  dVar11 = (double)precision;
  do {
    if (uVar8 == uVar7) {
      cv::Mat::operator=(Depth,&Z_img);
      cv::Mat::~Mat(&Z_img);
      return;
    }
    for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
      uVar1 = *(undefined8 *)
               ((cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
                m_data.array + 2);
      auVar14._0_8_ = (double)((float)(int)uVar5 - (float)uVar1);
      auVar14._8_8_ = (double)((float)(int)uVar8 - (float)((ulong)uVar1 >> 0x20));
      uVar1 = *(undefined8 *)
               (cam_params->super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.
               m_data.array;
      dVar12 = (double)(float)((ulong)uVar1 >> 0x20);
      auVar2._8_4_ = SUB84(dVar12,0);
      auVar2._0_8_ = (double)(float)uVar1;
      auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
      ret.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._0_16_
           = divpd(auVar14,auVar2);
      ret.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
           1.0;
      Eigen::internal::
      transform_right_product_impl<Eigen::Transform<double,_3,_2,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_2,_1>
      ::run((ResultType *)&local_68,transformation,&ret);
      local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)&camera;
      local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = (double)&local_68;
      Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
      _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&p,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_158);
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&p);
      local_1b8 = 0.0;
      uVar15 = 0;
      uVar16 = 0x3ff00000;
      dVar12 = (double)min_ray_length;
      for (iVar6 = 0; dVar3 = dVar12, iVar6 < max_steps; iVar6 = iVar6 + 1) {
        if ((double)max_ray_length <= dVar3) break;
        local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0] = (double)&camera;
        local_158.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1] = (double)&p;
        local_140 = dVar3;
        Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
        _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_68,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                    *)&local_158);
        dVar12 = SDF((Vector3d *)&local_68,primitives);
        if (dVar12 < dVar11) {
          if (local_1b8 < (double)min_ray_length) {
            lVar4 = *local_98 * uVar8;
            *(undefined4 *)(local_d0 + lVar4 + uVar5 * 4) = 0x7fc00000;
            goto LAB_0010f3ea;
          }
          RVar13 = Eigen::internal::
                   dot_nocheck<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_false>
                   ::run((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&viewAxis,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&p);
          fVar10 = ABS((float)(((((dVar3 + dVar11) - local_1b8) * (double)CONCAT44(uVar16,uVar15)) /
                                ((double)CONCAT44(uVar16,uVar15) - (dVar12 - dVar11)) + local_1b8) *
                              RVar13));
          lVar4 = *local_98 * uVar8;
          goto LAB_0010f476;
        }
        uVar15 = SUB84(dVar12,0);
        uVar16 = (undefined4)((ulong)dVar12 >> 0x20);
        dVar12 = dVar12 + dVar3;
        local_1b8 = dVar3;
      }
      lVar4 = *local_98 * uVar8;
LAB_0010f3ea:
      fVar10 = NAN;
LAB_0010f476:
      *(float *)(lVar4 + local_d0 + uVar5 * 4) = fVar10;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void RenderDepth(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length,
    const float min_ray_length,
    const float precision, 
    std::vector<Primitive*> &primitives, 
    cv::Mat &Depth)
  {

  // add noise to depth
  // std::mt19937_64 generator;
  // std::normal_distribution<float> distribution(0,RENDER_NOISE_STD);

  cv::Mat Z_img( rows, cols, CV_32FC1);

   Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
   Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized();

  //Rendering loop
  #pragma omp parallel for collapse(2)
  for(int u = 0; u < rows; ++u)
  {
    for(int v = 0; v < cols; ++v)
    {
      bool hit = false;
      Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;


      p.normalize();
            
      double scaling = min_ray_length;
      double scaling_prev=0;
      double D = 1.0;
      int steps=0;
      while(steps<max_steps && scaling < max_ray_length && !hit)
      { 

        double D_prev = D;
        D = sdf::SDF(camera + p*scaling, primitives);
        if(D < precision)
        {
          if(scaling_prev < min_ray_length)
          {
              Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
              break;
          }
          scaling = scaling_prev + ((scaling+precision) - scaling_prev)*D_prev/(D_prev - (D - precision));

          hit = true;
          float d = scaling*(viewAxis.dot(p));
          
          //conversion from range to depth
          // + scaling*scaling*distribution(generator)); //add noise dependent on the square of the distance
          Z_img.at<float>(u,v)=fabs(d);

          break;
        }
        scaling_prev = scaling;
        scaling += D;  
        ++steps;        
      }//ray
      if(!hit)     
      {
        Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
      }//no hit
    }//NUM_COLS
  }//NUM_ROWS
  Depth = Z_img;
  return;
  }